

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::remapIds
          (TIntermediate *this,TIdMaps *idMaps,longlong idShift,TIntermediate *unit)

{
  TIntermNode *pTVar1;
  undefined1 local_70 [8];
  TRemapIdTraverser idTraverser;
  TIntermediate *unit_local;
  longlong idShift_local;
  TIdMaps *idMaps_local;
  TIntermediate *this_local;
  
  idTraverser.idShift = (longlong)unit;
  TRemapIdTraverser::TRemapIdTraverser((TRemapIdTraverser *)local_70,idMaps,idShift);
  pTVar1 = getTreeRoot((TIntermediate *)idTraverser.idShift);
  (*pTVar1->_vptr_TIntermNode[2])(pTVar1,local_70);
  TRemapIdTraverser::~TRemapIdTraverser((TRemapIdTraverser *)local_70);
  return;
}

Assistant:

void TIntermediate::remapIds(const TIdMaps& idMaps, long long idShift, TIntermediate& unit)
{
    // Remap all IDs to either share or be unique, as dictated by the idMap and idShift.
    TRemapIdTraverser idTraverser(idMaps, idShift);
    unit.getTreeRoot()->traverse(&idTraverser);
}